

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void __thiscall
yolo_layer::yolo_layer
          (yolo_layer *this,int classes,vector<int,_std::allocator<int>_> *mask,
          vector<float,_std::allocator<float>_> *anchors,ggml_tensor *prev_layer)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  long in_R8;
  vector<float,_std::allocator<float>_> *__new_size;
  vector<float,_std::allocator<float>_> *this_00;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd0;
  
  *in_RDI = in_ESI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc8);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __new_size = (vector<float,_std::allocator<float>_> *)(in_RDI + 0xe);
  this_00 = __new_size;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x10cc4d);
  in_RDI[0x14] = *(undefined4 *)(in_R8 + 0x10);
  in_RDI[0x15] = *(undefined4 *)(in_R8 + 0x18);
  ggml_nbytes(in_R8);
  std::vector<float,_std::allocator<float>_>::resize(this_00,(size_type)__new_size);
  pfVar1 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x10cca6);
  uVar2 = ggml_nbytes(in_R8);
  ggml_backend_tensor_get(in_R8,pfVar1,0,uVar2);
  return;
}

Assistant:

yolo_layer(int classes, const std::vector<int> & mask, const std::vector<float> & anchors, struct ggml_tensor * prev_layer)
        : classes(classes), mask(mask), anchors(anchors)
    {
        w = prev_layer->ne[0];
        h = prev_layer->ne[1];
        predictions.resize(ggml_nbytes(prev_layer)/sizeof(float));
        ggml_backend_tensor_get(prev_layer, predictions.data(), 0, ggml_nbytes(prev_layer));
    }